

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O3

void __thiscall GameEngine::GameEngine(GameEngine *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int32_t iVar2;
  Config *this_00;
  string local_38;
  
  (this->players).
  super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->players).
  super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->manager).super___shared_ptr<Manager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->manager).super___shared_ptr<Manager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->map).super___shared_ptr<Map,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->players).
  super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Cat","");
  iVar2 = registerPlayer(this,&local_38);
  this->currentPlayer = iVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Bot","");
  iVar2 = registerPlayer(this,&local_38);
  this->botID = iVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  this_00 = Config::getInstance();
  iVar2 = Config::getMaxStepCount(this_00);
  this->maxStep = iVar2;
  this->currentStep = 0;
  nextStep(this);
  return;
}

Assistant:

GameEngine::GameEngine() {
  currentPlayer = registerPlayer(std::string("Cat"));
  botID = registerPlayer();

  maxStep = Config::getInstance().getMaxStepCount();
  currentStep = 0;

  nextStep();
}